

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_hash.c
# Opt level: O0

void gravity_hash_free(gravity_hash_t *hashtable)

{
  gravity_hash_iterate_fn p_Var1;
  hash_node_s *phVar2;
  hash_node_t *old_node;
  hash_node_t *node;
  uint32_t n;
  gravity_hash_iterate_fn free_fn;
  gravity_hash_t *hashtable_local;
  
  if (hashtable != (gravity_hash_t *)0x0) {
    p_Var1 = hashtable->free_fn;
    for (node._4_4_ = 0; node._4_4_ < hashtable->size; node._4_4_ = node._4_4_ + 1) {
      old_node = hashtable->nodes[node._4_4_];
      hashtable->nodes[node._4_4_] = (hash_node_t *)0x0;
      while (old_node != (hash_node_t *)0x0) {
        if (p_Var1 != (gravity_hash_iterate_fn)0x0) {
          (*p_Var1)(hashtable,old_node->key,old_node->value,hashtable->data);
        }
        phVar2 = old_node->next;
        free(old_node);
        old_node = phVar2;
      }
    }
    free(hashtable->nodes);
    free(hashtable);
  }
  return;
}

Assistant:

void gravity_hash_free (gravity_hash_t *hashtable) {
    if (!hashtable) return;
    gravity_hash_iterate_fn free_fn = hashtable->free_fn;

    for (uint32_t n = 0; n < hashtable->size; ++n) {
        hash_node_t *node = hashtable->nodes[n];
        hashtable->nodes[n] = NULL;
        while (node) {
            if (free_fn) free_fn(hashtable, node->key, node->value, hashtable->data);
            hash_node_t *old_node = node;
            node = node->next;
            mem_free(old_node);
        }
    }
    mem_free(hashtable->nodes);
    mem_free(hashtable);
    hashtable = NULL;
}